

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::InstDebugPrintfPass::ProcessImpl(InstDebugPrintfPass *this)

{
  Module *pMVar1;
  int iVar2;
  Instruction *pIVar3;
  Operand *this_00;
  IRContext *pIVar4;
  string set_name;
  string local_70;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::InstructionList::iterator,_spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,_false>,_unsigned_int,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp:446:7)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(spvtools::opt::InstructionList::iterator,_spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,_false>,_unsigned_int,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp:446:7)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  InstrumentPass::InstProcessEntryPointCallTree
            (&this->super_InstrumentPass,(InstProcessFunction *)&local_50);
  pIVar4 = (this->super_InstrumentPass).super_Pass.context_;
  if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar4);
  }
  pIVar3 = analysis::DefUseManager::GetDef
                     ((pIVar4->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,*(uint32_t *)&(this->super_InstrumentPass).field_0x244);
  IRContext::KillInst((this->super_InstrumentPass).super_Pass.context_,pIVar3);
  pIVar4 = (this->super_InstrumentPass).super_Pass.context_;
  pMVar1 = (pIVar4->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar3 = *(Instruction **)
            ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> +
            0x10);
  if (pIVar3 != (Instruction *)
                ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>
                + 8U)) {
    do {
      this_00 = Instruction::GetInOperand(pIVar3,0);
      Operand::AsString_abi_cxx11_(&local_70,this_00);
      iVar2 = std::__cxx11::string::compare((ulong)&local_70,0,(char *)0xc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (iVar2 == 0) goto LAB_00222abe;
      pIVar3 = (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      pIVar4 = (this->super_InstrumentPass).super_Pass.context_;
    } while (pIVar3 != (Instruction *)
                       ((long)&(((pIVar4->module_)._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl
                                )->ext_inst_imports_).
                               super_IntrusiveList<spvtools::opt::Instruction> + 8U));
  }
  IRContext::RemoveExtension(pIVar4,kSPV_KHR_non_semantic_info);
LAB_00222abe:
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return SuccessWithChange;
}

Assistant:

Pass::Status InstDebugPrintfPass::ProcessImpl() {
  // Perform printf instrumentation on each entry point function in module
  InstProcessFunction pfn =
      [this](BasicBlock::iterator ref_inst_itr,
             UptrVectorIterator<BasicBlock> ref_block_itr,
             [[maybe_unused]] uint32_t stage_idx,
             std::vector<std::unique_ptr<BasicBlock>>* new_blocks) {
        return GenDebugPrintfCode(ref_inst_itr, ref_block_itr, new_blocks);
      };
  (void)InstProcessEntryPointCallTree(pfn);
  // Remove DebugPrintf OpExtInstImport instruction
  Instruction* ext_inst_import_inst =
      get_def_use_mgr()->GetDef(ext_inst_printf_id_);
  context()->KillInst(ext_inst_import_inst);
  // If no remaining non-semantic instruction sets, remove non-semantic debug
  // info extension from module and feature manager
  bool non_sem_set_seen = false;
  for (auto c_itr = context()->module()->ext_inst_import_begin();
       c_itr != context()->module()->ext_inst_import_end(); ++c_itr) {
    const std::string set_name = c_itr->GetInOperand(0).AsString();
    if (spvtools::utils::starts_with(set_name, "NonSemantic.")) {
      non_sem_set_seen = true;
      break;
    }
  }
  if (!non_sem_set_seen) {
    context()->RemoveExtension(kSPV_KHR_non_semantic_info);
  }
  return Status::SuccessWithChange;
}